

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O1

void ps_hints_t1stem3(PS_Hints hints,FT_UInt dimension,FT_Fixed *stems)

{
  uint uVar1;
  FT_Memory memory;
  FT_Error FVar2;
  FT_Fixed FVar3;
  FT_Fixed FVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  uint local_4c [2];
  FT_Int idx [3];
  
  if (hints->error != 0) {
    return;
  }
  bVar7 = dimension != 0;
  bVar8 = true;
  FVar2 = 6;
  if (hints->hint_type != PS_HINT_TYPE_1) goto LAB_00215663;
  memory = hints->memory;
  lVar6 = 0;
  do {
    FVar3 = FT_RoundFix(*(FT_Fixed *)((long)stems + lVar6 * 4));
    FVar4 = FT_RoundFix(*(FT_Fixed *)((long)stems + lVar6 * 4 + 8));
    FVar2 = ps_dimension_add_t1stem
                      ((PS_Dimension)
                       ((long)&hints->dimension[0].hints.num_hints + (ulong)((uint)bVar7 * 0x30)),
                       (FT_Int)((ulong)FVar3 >> 0x10),(FT_Int)((ulong)FVar4 >> 0x10),memory,
                       (FT_Int *)((long)local_4c + lVar6));
    if (FVar2 != 0) {
      bVar8 = true;
      goto LAB_00215663;
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0xc);
  iVar5 = *(int *)((long)&hints->dimension[0].counters.num_masks + (ulong)((uint)bVar7 * 0x30));
  idx._4_8_ = *(undefined8 *)
               ((long)&hints->dimension[0].counters.masks + (ulong)((uint)bVar7 * 0x30));
  if (iVar5 != 0) {
    do {
      uVar1 = *(uint *)idx._4_8_;
      if ((((local_4c[0] < uVar1) &&
           ((0x80U >> ((byte)local_4c[0] & 7) &
            (uint)*(byte *)(*(long *)(idx._4_8_ + 8) + (long)((int)local_4c[0] >> 3))) != 0)) ||
          ((local_4c[1] < uVar1 &&
           ((0x80U >> ((byte)local_4c[1] & 7) &
            (uint)*(byte *)(*(long *)(idx._4_8_ + 8) + (long)((int)local_4c[1] >> 3))) != 0)))) ||
         (((uint)idx[0] < uVar1 &&
          ((0x80U >> ((byte)idx[0] & 7) &
           (uint)*(byte *)(*(long *)(idx._4_8_ + 8) + (long)(idx[0] >> 3))) != 0))))
      goto LAB_002155fb;
      idx._4_8_ = idx._4_8_ + 0x18;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  FVar2 = ps_mask_table_alloc((PS_Mask_Table)
                              ((long)&hints->dimension[0].counters.num_masks +
                              (ulong)((uint)bVar7 * 0x30)),memory,(PS_Mask *)(idx + 1));
  if (FVar2 == 0) {
LAB_002155fb:
    if (((int)local_4c[0] < 0) ||
       (FVar2 = ps_mask_set_bit((PS_Mask)idx._4_8_,local_4c[0],memory), FVar2 == 0)) {
      if ((int)local_4c[1] < 0) {
        if (-1 < idx[0]) goto LAB_0021564d;
        FVar2 = 0;
      }
      else {
        FVar2 = ps_mask_set_bit((PS_Mask)idx._4_8_,local_4c[1],memory);
        if (-1 < idx[0] && FVar2 == 0) {
LAB_0021564d:
          FVar2 = ps_mask_set_bit((PS_Mask)idx._4_8_,idx[0],memory);
        }
      }
    }
  }
  bVar8 = FVar2 != 0;
LAB_00215663:
  if (bVar8) {
    hints->error = FVar2;
  }
  return;
}

Assistant:

static void
  ps_hints_t1stem3( PS_Hints   hints,
                    FT_UInt    dimension,
                    FT_Fixed*  stems )
  {
    FT_Error  error = FT_Err_Ok;


    if ( !hints->error )
    {
      PS_Dimension  dim;
      FT_Memory     memory = hints->memory;
      FT_Int        count;
      FT_Int        idx[3];


      /* limit "dimension" to 0..1 */
      if ( dimension > 1 )
      {
        FT_TRACE0(( "ps_hints_t1stem3: invalid dimension (%d) used\n",
                    dimension ));
        dimension = ( dimension != 0 );
      }

      dim = &hints->dimension[dimension];

      /* there must be 6 elements in the 'stem' array */
      if ( hints->hint_type == PS_HINT_TYPE_1 )
      {
        /* add the three stems to our hints/masks table */
        for ( count = 0; count < 3; count++, stems += 2 )
        {
          error = ps_dimension_add_t1stem( dim,
                                           (FT_Int)FIXED_TO_INT( stems[0] ),
                                           (FT_Int)FIXED_TO_INT( stems[1] ),
                                           memory, &idx[count] );
          if ( error )
            goto Fail;
        }

        /* now, add the hints to the counters table */
        error = ps_dimension_add_counter( dim, idx[0], idx[1], idx[2],
                                          memory );
        if ( error )
          goto Fail;
      }
      else
      {
        FT_ERROR(( "ps_hints_t1stem3: called with invalid hint type\n" ));
        error = FT_THROW( Invalid_Argument );
        goto Fail;
      }
    }

    return;

  Fail:
    FT_ERROR(( "ps_hints_t1stem3: could not add counter stems to table\n" ));
    hints->error = error;
  }